

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

char * cmime_message_generate_boundary(void)

{
  int iVar1;
  int local_34;
  char *pcStack_30;
  int i;
  char *boundary;
  char str [21];
  
  pcStack_30 = (char *)0x0;
  for (local_34 = 0; local_34 < 0x14; local_34 = local_34 + 1) {
    iVar1 = cmime_util_rand();
    str[(long)local_34 + -8] =
         "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789._-="
         [(ulong)(long)iVar1 % 0x42];
  }
  str[0xc] = '\0';
  asprintf(&stack0xffffffffffffffd0,"--=_Part_%s",&boundary);
  return pcStack_30;
}

Assistant:

char *cmime_message_generate_boundary(void) {
    char str[21];
    char *boundary = NULL;
    int i;
    static const char text[] = "abcdefghijklmnopqrstuvwxyz"
                               "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                               "0123456789._-=";

    for ( i = 0; i < 20; ++i ) {
        str[i] = text[cmime_util_rand() % (sizeof text - 1)];
    }
    str[20] = '\0';
    
    asprintf(&boundary,"--=_Part_%s",str);
    return(boundary);
}